

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall wabt::SharedValidator::OnMemoryCopy(SharedValidator *this,Location *loc)

{
  Result RVar1;
  Result RVar2;
  MemoryType mt;
  Limits local_88;
  Var local_68;
  
  local_88.initial = 0;
  local_88.max._0_7_ = 0;
  local_88._15_4_ = 0;
  this->expr_loc_ = loc;
  Var::Var(&local_68,0,loc);
  RVar1 = CheckMemoryIndex(this,&local_68,(MemoryType *)&local_88);
  Var::~Var(&local_68);
  RVar2 = TypeChecker::OnMemoryCopy(&this->typechecker_,&local_88);
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnMemoryCopy(const Location& loc) {
  Result result = Result::Ok;
  MemoryType mt;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc), &mt);
  result |= typechecker_.OnMemoryCopy(mt.limits);
  return result;
}